

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP5Writer::MarshalAttributes(BP5Writer *this)

{
  DataType Type;
  _Hash_node_base *p_Var1;
  IO *pIVar2;
  BP5Writer *pBVar3;
  int iVar4;
  AttrMap *pAVar5;
  Attribute<signed_char> *pAVar6;
  Attribute<char> *pAVar7;
  Attribute<std::complex<float>_> *pAVar8;
  Attribute<unsigned_char> *pAVar9;
  Attribute<std::complex<double>_> *pAVar10;
  Attribute<double> *pAVar11;
  Attribute<int> *pAVar12;
  Attribute<long> *pAVar13;
  Attribute<unsigned_long> *pAVar14;
  Attribute<short> *pAVar15;
  Attribute<unsigned_short> *pAVar16;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar17;
  Attribute<unsigned_int> *pAVar18;
  Attribute<long_double> *pAVar19;
  Attribute<float> *pAVar20;
  pointer Data;
  long lVar21;
  uint uVar22;
  size_t sVar23;
  complex<float> *Data_00;
  uchar *Data_01;
  complex<double> *Data_02;
  double *Data_03;
  int *Data_04;
  long *Data_05;
  unsigned_long *Data_06;
  char *pcVar24;
  short *Data_07;
  unsigned_short *Data_08;
  uint *Data_09;
  longdouble *Data_10;
  float *Data_11;
  _Hash_node_base *p_Var25;
  string name;
  ScopedTimer __var2488;
  string local_268;
  BP5Writer *local_248;
  BP5Serializer *local_240;
  string local_238;
  ScopedTimer local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_248 = this;
  if ((MarshalAttributes()::__var488 == '\0') &&
     (iVar4 = __cxa_guard_acquire(&MarshalAttributes()::__var488), iVar4 != 0)) {
    MarshalAttributes::__var488 = (void *)ps_timer_create_("BP5Writer::MarshalAttributes");
    __cxa_guard_release(&MarshalAttributes()::__var488);
  }
  local_218.m_timer = MarshalAttributes::__var488;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  pBVar3 = local_248;
  pAVar5 = IO::GetAttributes_abi_cxx11_((local_248->super_Engine).m_IO);
  if (pBVar3->m_MarshalAttributesNecessary != false) {
    local_248->m_MarshalAttributesNecessary = false;
    p_Var25 = (pAVar5->_M_h)._M_before_begin._M_nxt;
    if (p_Var25 != (_Hash_node_base *)0x0) {
      local_240 = &local_248->m_BP5Serializer;
      do {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,p_Var25[1]._M_nxt,
                   (long)&(p_Var25[1]._M_nxt)->_M_nxt + (long)&(p_Var25[2]._M_nxt)->_M_nxt);
        p_Var1 = p_Var25[5]._M_nxt;
        uVar22 = 0xffffffff;
        if (*(char *)&p_Var1[7]._M_nxt == '\0') {
          uVar22 = *(uint *)&p_Var1[6]._M_nxt;
        }
        Type = *(DataType *)&p_Var1[5]._M_nxt;
        switch(Type) {
        case Int8:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/","");
          pAVar6 = IO::InquireAttribute<signed_char>(pIVar2,&local_238,&local_268,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar6->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar6->super_AttributeBase).m_Elements;
            pcVar24 = (pAVar6->m_DataArray).
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            pcVar24 = &pAVar6->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar6->super_AttributeBase).m_Name._M_dataplus._M_p,Type,1,sVar23,
                     pcVar24);
          break;
        case Int16:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/","");
          pAVar15 = IO::InquireAttribute<short>(pIVar2,&local_238,&local_268,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar15->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar15->super_AttributeBase).m_Elements;
            Data_07 = (pAVar15->m_DataArray).super__Vector_base<short,_std::allocator<short>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            Data_07 = &pAVar15->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar15->super_AttributeBase).m_Name._M_dataplus._M_p,Type,2,sVar23,
                     Data_07);
          break;
        case Int32:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/","");
          pAVar12 = IO::InquireAttribute<int>(pIVar2,&local_238,&local_268,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar12->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar12->super_AttributeBase).m_Elements;
            Data_04 = (pAVar12->m_DataArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            Data_04 = &pAVar12->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar12->super_AttributeBase).m_Name._M_dataplus._M_p,Type,4,sVar23,
                     Data_04);
          break;
        case Int64:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
          pAVar13 = IO::InquireAttribute<long>(pIVar2,&local_238,&local_268,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar13->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar13->super_AttributeBase).m_Elements;
            Data_05 = (pAVar13->m_DataArray).super__Vector_base<long,_std::allocator<long>_>._M_impl
                      .super__Vector_impl_data._M_start;
          }
          else {
            Data_05 = &pAVar13->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar13->super_AttributeBase).m_Name._M_dataplus._M_p,Type,8,sVar23,
                     Data_05);
          break;
        case UInt8:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/","");
          pAVar9 = IO::InquireAttribute<unsigned_char>(pIVar2,&local_238,&local_268,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar9->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar9->super_AttributeBase).m_Elements;
            Data_01 = (pAVar9->m_DataArray).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            Data_01 = &pAVar9->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar9->super_AttributeBase).m_Name._M_dataplus._M_p,Type,1,sVar23,
                     Data_01);
          break;
        case UInt16:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"/","");
          pAVar16 = IO::InquireAttribute<unsigned_short>(pIVar2,&local_238,&local_268,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar16->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar16->super_AttributeBase).m_Elements;
            Data_08 = (pAVar16->m_DataArray).
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            Data_08 = &pAVar16->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar16->super_AttributeBase).m_Name._M_dataplus._M_p,Type,2,sVar23,
                     Data_08);
          break;
        case UInt32:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/","");
          pAVar18 = IO::InquireAttribute<unsigned_int>(pIVar2,&local_238,&local_268,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar18->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar18->super_AttributeBase).m_Elements;
            Data_09 = (pAVar18->m_DataArray).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            Data_09 = &pAVar18->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar18->super_AttributeBase).m_Name._M_dataplus._M_p,Type,4,sVar23,
                     Data_09);
          break;
        case UInt64:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/","");
          pAVar14 = IO::InquireAttribute<unsigned_long>(pIVar2,&local_238,&local_268,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar14->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar14->super_AttributeBase).m_Elements;
            Data_06 = (pAVar14->m_DataArray).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            Data_06 = &pAVar14->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar14->super_AttributeBase).m_Name._M_dataplus._M_p,Type,8,sVar23,
                     Data_06);
          break;
        case Float:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/","");
          pAVar20 = IO::InquireAttribute<float>(pIVar2,&local_238,&local_268,&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar20->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar20->super_AttributeBase).m_Elements;
            Data_11 = (pAVar20->m_DataArray).super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            Data_11 = &pAVar20->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar20->super_AttributeBase).m_Name._M_dataplus._M_p,Type,4,sVar23,
                     Data_11);
          break;
        case Double:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/","");
          pAVar11 = IO::InquireAttribute<double>(pIVar2,&local_238,&local_268,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar11->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar11->super_AttributeBase).m_Elements;
            Data_03 = (pAVar11->m_DataArray).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            Data_03 = &pAVar11->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar11->super_AttributeBase).m_Name._M_dataplus._M_p,Type,8,sVar23,
                     Data_03);
          break;
        case LongDouble:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"/","");
          pAVar19 = IO::InquireAttribute<long_double>(pIVar2,&local_238,&local_268,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar19->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar19->super_AttributeBase).m_Elements;
            Data_10 = (pAVar19->m_DataArray).
                      super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            Data_10 = &pAVar19->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar19->super_AttributeBase).m_Name._M_dataplus._M_p,Type,0x10,
                     sVar23,Data_10);
          break;
        case FloatComplex:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/","");
          pAVar8 = IO::InquireAttribute<std::complex<float>>
                             (pIVar2,&local_238,&local_268,&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar8->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar8->super_AttributeBase).m_Elements;
            Data_00 = (pAVar8->m_DataArray).
                      super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            Data_00 = &pAVar8->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar8->super_AttributeBase).m_Name._M_dataplus._M_p,Type,8,sVar23,
                     Data_00);
          break;
        case DoubleComplex:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/","");
          pAVar10 = IO::InquireAttribute<std::complex<double>>
                              (pIVar2,&local_238,&local_268,&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar10->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar10->super_AttributeBase).m_Elements;
            Data_02 = (pAVar10->m_DataArray).
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            Data_02 = &pAVar10->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar10->super_AttributeBase).m_Name._M_dataplus._M_p,Type,0x10,
                     sVar23,Data_02);
          break;
        case String:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/","");
          pAVar17 = IO::InquireAttribute<std::__cxx11::string>
                              (pIVar2,&local_238,&local_268,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar17->super_AttributeBase).m_IsSingleValue == true) {
            Data = (pAVar17->m_DataSingleValue)._M_dataplus._M_p;
          }
          else {
            Data = (pointer)malloc((long)(int)uVar22 * 8);
            if (0 < (int)uVar22) {
              lVar21 = 0;
              do {
                *(undefined8 *)(Data + lVar21) =
                     *(undefined8 *)
                      ((long)&(((pAVar17->m_DataArray).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar21 * 4);
                lVar21 = lVar21 + 8;
              } while ((ulong)uVar22 << 3 != lVar21);
            }
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,local_238._M_dataplus._M_p,Type,8,(long)(int)uVar22,Data);
          if ((pAVar17->super_AttributeBase).m_IsSingleValue == false) {
            free(Data);
          }
          break;
        case Char:
          pIVar2 = (local_248->super_Engine).m_IO;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
          pAVar7 = IO::InquireAttribute<char>(pIVar2,&local_238,&local_268,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((pAVar7->super_AttributeBase).m_IsSingleValue == false) {
            sVar23 = (size_t)(int)(pAVar7->super_AttributeBase).m_Elements;
            pcVar24 = (pAVar7->m_DataArray).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            pcVar24 = &pAVar7->m_DataSingleValue;
            sVar23 = 0xffffffffffffffff;
          }
          adios2::format::BP5Serializer::MarshalAttribute
                    (local_240,(pAVar7->super_AttributeBase).m_Name._M_dataplus._M_p,Type,1,sVar23,
                     pcVar24);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        p_Var25 = p_Var25->_M_nxt;
      } while (p_Var25 != (_Hash_node_base *)0x0);
    }
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_218);
  return;
}

Assistant:

void BP5Writer::MarshalAttributes()
{
    PERFSTUBS_SCOPED_TIMER("BP5Writer::MarshalAttributes");
    const auto &attributes = m_IO.GetAttributes();

    // if there are no new attributes, nothing to do
    if (!m_MarshalAttributesNecessary)
    {
        return;
    }
    m_MarshalAttributesNecessary = false;

    for (const auto &attributePair : attributes)
    {
        const std::string name(attributePair.first);
        auto baseAttr = &attributePair.second;
        const DataType type((*baseAttr)->m_Type);
        int element_count = -1;

        if (!attributePair.second->m_IsSingleValue)
        {
            element_count = (int)(*baseAttr)->m_Elements;
        }

        if (type == DataType::None)
        {
        }
        else if (type == helper::GetDataType<std::string>())
        {
            core::Attribute<std::string> &attribute = *m_IO.InquireAttribute<std::string>(name);
            void *data_addr;
            if (attribute.m_IsSingleValue)
            {
                data_addr = (void *)attribute.m_DataSingleValue.c_str();
            }
            else
            {
                const char **tmp = (const char **)malloc(sizeof(char *) * element_count);
                for (int i = 0; i < element_count; i++)
                {
                    auto str = &attribute.m_DataArray[i];
                    tmp[i] = str->c_str();
                }
                // tmp will be free'd after final attribute marshalling
                data_addr = (void *)tmp;
            }

            m_BP5Serializer.MarshalAttribute(name.c_str(), type, sizeof(char *), element_count,
                                             data_addr);
            if (!attribute.m_IsSingleValue)
            {
                // array of strings
                free(data_addr);
            }
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        core::Attribute<T> &attribute = *m_IO.InquireAttribute<T>(name);                           \
        int element_count = -1;                                                                    \
        void *data_addr = &attribute.m_DataSingleValue;                                            \
        if (!attribute.m_IsSingleValue)                                                            \
        {                                                                                          \
            element_count = (int)attribute.m_Elements;                                             \
            data_addr = attribute.m_DataArray.data();                                              \
        }                                                                                          \
        m_BP5Serializer.MarshalAttribute(attribute.m_Name.c_str(), type, sizeof(T), element_count, \
                                         data_addr);                                               \
    }

        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
}